

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Shader *shader,string *prop_name,Property *out_prop)

{
  _Alloc_hider *p_Var1;
  Value *this;
  vtable_type *pvVar2;
  int iVar3;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar4;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  const_iterator cVar5;
  undefined8 uVar6;
  undefined7 uVar8;
  undefined7 extraout_var;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX_00;
  UsdTransform2d *tx;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar7;
  UsdUVTexture *tex;
  UsdPreviewSurface *surface;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *err;
  string *extraout_RDX_01;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input;
  _Alloc_hider _Var9;
  unexpected_type<const_char_*> uVar10;
  unexpected_type<const_char_*> local_90;
  undefined8 local_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  bool local_40;
  uint7 uStack_3f;
  size_type sStack_38;
  
  if (out_prop == (Property *)0x0) {
    local_90.m_error = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_90);
    return extraout_RAX;
  }
  this = &shader->value;
  pUVar4 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
           tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<float>>(this,false);
  if (pUVar4 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
    pUVar4 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
             tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                       (this,false);
    if ((pUVar4 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) &&
       (pUVar4 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
                 tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                           (this,false), pUVar4 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0)
       ) {
      pUVar4 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                         (this,false);
      if (pUVar4 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
        tx = tinyusdz::value::Value::as<tinyusdz::UsdTransform2d>(this,false);
        if (tx != (UsdTransform2d *)0x0) {
          peVar7 = GetPrimProperty<tinyusdz::UsdTransform2d>
                             (__return_storage_ptr__,tx,prop_name,out_prop);
          return peVar7;
        }
        tex = tinyusdz::value::Value::as<tinyusdz::UsdUVTexture>(this,false);
        if (tex != (UsdUVTexture *)0x0) {
          peVar7 = GetPrimProperty<tinyusdz::UsdUVTexture>
                             (__return_storage_ptr__,tex,prop_name,out_prop);
          return peVar7;
        }
        surface = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(this,false);
        if (surface != (UsdPreviewSurface *)0x0) {
          peVar7 = GetPrimProperty<tinyusdz::UsdPreviewSurface>
                             (__return_storage_ptr__,surface,prop_name,out_prop);
          return peVar7;
        }
        pvVar2 = (shader->value).v_.vtable;
        if (pvVar2 == (vtable_type *)0x0) {
          local_60._0_4_ = 0x64696f76;
          local_80._24_8_ = 4;
          local_60._4_4_ = local_60._4_4_ & 0xffffff00;
          local_80._16_8_ =
               (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60;
        }
        else {
          (*pvVar2->type_name)((string *)(local_80 + 0x10));
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_60 + 0x10),"TODO: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_80 + 0x10));
        uVar6 = local_60._24_8_;
        local_90.m_error = local_80;
        if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_60._16_8_ ==
            (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_60 + 0x20)) {
          local_80._8_8_ = sStack_38;
          local_60._16_8_ = local_90.m_error;
        }
        local_80._1_7_ = uStack_3f;
        local_80[0] = local_40;
        local_60._24_8_ = 0;
        local_40 = false;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        p_Var1 = (_Alloc_hider *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10);
        *(_Alloc_hider **)
         &(__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = p_Var1;
        if ((error_type)local_60._16_8_ == local_90.m_error) {
          p_Var1->_M_p = (pointer)local_80._0_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->contained).
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x18) = local_80._8_8_;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = (pointer)local_60._16_8_;
          ((_Alloc_hider *)
          ((long)&(__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0 + 0x10))->_M_p = (pointer)local_80._0_8_;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_string_length = uVar6;
        local_88 = 0;
        local_80._0_8_ = (ulong)uStack_3f << 8;
        if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_80._16_8_ ==
            (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_60) {
          return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90.m_error;
        }
        _Var9._M_p = (pointer)CONCAT44(local_60._4_4_,local_60._0_4_);
        uVar10.m_error = (error_type)local_80._16_8_;
        local_60._16_8_ =
             (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_60 + 0x20);
        goto LAB_00339708;
      }
      local_90.m_error = local_80;
      local_88 = 0;
      local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
      iVar3 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar3 == 0) {
        input = &pUVar4->varname;
        err = extraout_RDX_01;
        goto LAB_003396e6;
      }
    }
    else {
      local_90.m_error = local_80;
      local_88 = 0;
      local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
      iVar3 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar3 == 0) {
        input = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pUVar4->fallback)._blocked;
        err = extraout_RDX_00;
        goto LAB_003396e6;
      }
    }
LAB_00339598:
    cVar5 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)&(pUVar4->super_ShaderNode).super_UsdShadePrim.props,prop_name);
    if ((_Rb_tree_header *)cVar5._M_node !=
        &(pUVar4->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.super__Rb_tree_header) {
      ::std::__cxx11::string::_M_assign((string *)out_prop);
      (out_prop->_attrib)._varying_authored = (bool)cVar5._M_node[3].field_0x4;
      (out_prop->_attrib)._variability = cVar5._M_node[3]._M_color;
      ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
      linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar5._M_node[4]._M_parent);
      (out_prop->_attrib)._var._blocked = SUB41(cVar5._M_node[5]._M_color,0);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=(&(out_prop->_attrib)._var._ts._samples,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&cVar5._M_node[5]._M_parent);
      (out_prop->_attrib)._var._ts._dirty = SUB41(cVar5._M_node[6]._M_color,0);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(out_prop->_attrib)._paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar5._M_node[6]._M_parent);
      AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar5._M_node + 7));
      *(_Base_ptr *)&out_prop->_listOpQual = cVar5._M_node[0x17]._M_parent;
      (out_prop->_rel).type = *(Type *)&cVar5._M_node[0x17]._M_left;
      Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar5._M_node[0x17]._M_right);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(out_prop->_rel).targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 &cVar5._M_node[0x1e]._M_parent);
      (out_prop->_rel).listOpQual = cVar5._M_node[0x1f]._M_color;
      AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar5._M_node[0x1f]._M_parent);
      (out_prop->_rel)._varying_authored = *(bool *)&cVar5._M_node[0x2f]._M_left;
      uVar6 = ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
      uVar8 = (undefined7)((ulong)uVar6 >> 8);
      out_prop->_has_custom = *(bool *)&cVar5._M_node[0x30]._M_right;
      goto LAB_003396f1;
    }
    peVar7 = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  }
  else {
    local_90.m_error = local_80;
    local_88 = 0;
    local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
    iVar3 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar3 != 0) goto LAB_00339598;
    input = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&(pUVar4->fallback)._attrib.contained + 0x30);
    err = extraout_RDX;
LAB_003396e6:
    (anonymous_namespace)::ToProperty<std::__cxx11::string>(input,out_prop,err);
    uVar8 = extraout_var;
LAB_003396f1:
    peVar7 = (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT71(uVar8,1);
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = SUB81(peVar7,0);
  _Var9._M_p = (pointer)local_80._0_8_;
  uVar10.m_error = local_90.m_error;
  if ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_90.m_error ==
      (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_80) {
    return peVar7;
  }
LAB_00339708:
  operator_delete(uVar10.m_error,(ulong)(_Var9._M_p + 1));
  return extraout_RAX_00;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const Shader &shader, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  if (const auto preader_f = shader.value.as<UsdPrimvarReader_float>()) {
    return GetPrimProperty(*preader_f, prop_name, out_prop);
  } else if (const auto preader_f2 =
                 shader.value.as<UsdPrimvarReader_float2>()) {
    return GetPrimProperty(*preader_f2, prop_name, out_prop);
  } else if (const auto preader_f3 =
                 shader.value.as<UsdPrimvarReader_float3>()) {
    return GetPrimProperty(*preader_f3, prop_name, out_prop);
  } else if (const auto preader_f4 =
                 shader.value.as<UsdPrimvarReader_float4>()) {
    return GetPrimProperty(*preader_f4, prop_name, out_prop);
  } else if (const auto ptx2d = shader.value.as<UsdTransform2d>()) {
    return GetPrimProperty(*ptx2d, prop_name, out_prop);
  } else if (const auto ptex = shader.value.as<UsdUVTexture>()) {
    return GetPrimProperty(*ptex, prop_name, out_prop);
  } else if (const auto psurf = shader.value.as<UsdPreviewSurface>()) {
    return GetPrimProperty(*psurf, prop_name, out_prop);
  } else {
    return nonstd::make_unexpected("TODO: " + shader.value.type_name());
  }
}